

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void preconditioner_to_regularizer<dense_parameters>
               (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  float fVar1;
  weight *pwVar2;
  uint32_t uVar3;
  ulong uVar4;
  float *pfVar5;
  weight *pwVar6;
  vw_exception *this;
  uint64_t uVar7;
  long lVar8;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (b->regularizers == (weight *)0x0) {
    pfVar5 = calloc_or_throw<float>((ulong)(uint)(2 << ((byte)all->num_bits & 0x1f)));
    b->regularizers = pfVar5;
    if (pfVar5 == (float *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,"Failed to allocate weight array: try decreasing -b <bits>",0x39);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                 ,0x21a,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pwVar2 = weights->_begin;
    uVar7 = weights->_weight_mask;
    pwVar6 = pwVar2;
    if (pwVar2 != pwVar2 + uVar7 + 1) {
      uVar3 = weights->_stride_shift;
      lVar8 = 0;
      do {
        uVar4 = (ulong)(lVar8 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
        b->regularizers[uVar4 * 2] = regularization;
        fVar1 = *(float *)((long)pwVar2 + lVar8 + 0xc);
        if (0.0 < fVar1) {
          b->regularizers[uVar4 * 2] = 1.0 / fVar1 + b->regularizers[uVar4 * 2];
        }
        uVar7 = weights->_weight_mask;
        lVar8 = lVar8 + (1L << ((byte)uVar3 & 0x3f)) * 4;
        pwVar6 = weights->_begin;
      } while ((weight *)((long)pwVar2 + lVar8) != weights->_begin + uVar7 + 1);
    }
  }
  else {
    pwVar2 = weights->_begin;
    uVar7 = weights->_weight_mask;
    pwVar6 = pwVar2;
    if (pwVar2 != pwVar2 + uVar7 + 1) {
      uVar3 = weights->_stride_shift;
      lVar8 = 0;
      do {
        fVar1 = *(float *)((long)pwVar2 + lVar8 + 0xc);
        if (0.0 < fVar1) {
          uVar4 = (ulong)(lVar8 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
          b->regularizers[uVar4 * 2] = 1.0 / fVar1 + b->regularizers[uVar4 * 2];
          pwVar6 = weights->_begin;
          uVar7 = weights->_weight_mask;
        }
        lVar8 = lVar8 + (1L << ((byte)uVar3 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar2 + lVar8) != pwVar6 + uVar7 + 1);
    }
  }
  if (pwVar6 != pwVar6 + uVar7 + 1) {
    uVar3 = weights->_stride_shift;
    lVar8 = 0;
    do {
      b->regularizers[((ulong)(lVar8 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * 2 + 1] =
           *(weight *)((long)pwVar6 + lVar8);
      lVar8 = lVar8 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar6 + lVar8) != weights->_begin + weights->_weight_mask + 1);
  }
  return;
}

Assistant:

void preconditioner_to_regularizer(vw& all, bfgs& b, float regularization, T& weights)
{
  uint32_t length = 1 << all.num_bits;

  if (b.regularizers == nullptr)
  {
    b.regularizers = calloc_or_throw<weight>(2 * length);

    if (b.regularizers == nullptr)
      THROW("Failed to allocate weight array: try decreasing -b <bits>");

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      b.regularizers[2 * i] = regularization;
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * i] += 1.f / (&(*w))[W_COND];
    }
  }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * (w.index() >> weights.stride_shift())] += 1.f / (&(*w))[W_COND];
    }

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    b.regularizers[2 * (w.index() >> weights.stride_shift()) + 1] = *w;
}